

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t tree_enter_working_dir(tree *t)

{
  wchar_t wVar1;
  
  wVar1 = L'\0';
  if (((0 < t->depth) && ((t->flags & 0x40) == 0)) &&
     (wVar1 = fchdir(t->working_dir_fd), wVar1 == L'\0')) {
    t->flags = t->flags & 0xfffffebfU | 0x40;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
tree_enter_working_dir(struct tree *t)
{
	int r = 0;

	/*
	 * Change the current directory if really needed.
	 * Sometimes this is unneeded when we did not do
	 * descent.
	 */
	if (t->depth > 0 && (t->flags & onWorkingDir) == 0) {
		r = fchdir(t->working_dir_fd);
		if (r == 0) {
			t->flags &= ~onInitialDir;
			t->flags |= onWorkingDir;
		}
	}
	return (r);
}